

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool __thiscall Analyser::analyse_function_definition(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *this_00;
  string local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  string func;
  string local_a0;
  optional<Token> local_80;
  char local_51;
  undefined4 local_50;
  char type;
  undefined1 local_40 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_40,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
  if (bVar1) {
    pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
    TVar2 = Token::GetType(pTVar3);
    if (TVar2 == RESERVED_WORD) {
      unreadToken(this);
      local_51 = analyse_type_specifier(this);
      nextToken(&local_80,this);
      std::optional<Token>::operator=((optional<Token> *)local_40,&local_80);
      std::optional<Token>::~optional(&local_80);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
      if (!bVar1) {
LAB_001280e9:
        func.field_2._M_local_buf[0xe] = '\x01';
        this_00 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Missing identifier",
                   (allocator<char> *)(func.field_2._M_local_buf + 0xf));
        Error::Error(this_00,&local_a0,(long)this->_currentLine);
        func.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
      TVar2 = Token::GetType(pTVar3);
      if (TVar2 != IDENTIFIER) goto LAB_001280e9;
      std::optional<Token>::value((optional<Token> *)local_40);
      Token::GetValue((Token *)local_d8);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (any *)local_d8);
      std::any::~any((any *)local_d8);
      std::__cxx11::string::string((string *)&local_f8,(string *)local_c8);
      addFunction(this,&local_f8,local_51);
      std::__cxx11::string::~string((string *)&local_f8);
      pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
      addConstant(this,pTVar3);
      analyse_parameter_clause(this);
      analyse_compound_statement(this);
      addRet(this);
      this_local._7_1_ = true;
      local_50 = 1;
      std::__cxx11::string::~string((string *)local_c8);
      goto LAB_00128301;
    }
  }
  unreadToken(this);
  this_local._7_1_ = false;
  local_50 = 1;
LAB_00128301:
  std::optional<Token>::~optional((optional<Token> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Analyser::analyse_function_definition() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
		unreadToken();
		return false;
	}
	unreadToken();
	char type = analyse_type_specifier();
	//<identifier>
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	addFunction(func, type);
	addConstant(next.value());
	//<parameter - clause>
	analyse_parameter_clause();
	analyse_compound_statement();
	addRet();
	return true;
}